

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZWavyLine>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZWavyLine> *this,int64_t id,TPZVec<long> *nodeindexes,
          int matind,TPZGeoMesh *mesh)

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoMesh *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  int64_t in_stack_ffffffffffffff60;
  TPZVec<long> *in_stack_ffffffffffffff68;
  TPZWavyLine *in_stack_ffffffffffffff70;
  int64_t *local_80;
  TPZGeoElSideIndex local_60;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  
  local_30 = 0;
  local_38 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZWavyLine>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0245b228);
  TPZGeoEl::TPZGeoEl((TPZGeoEl *)in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->_vptr_TPZVec,
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245af10;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245af10;
  pzgeom::TPZWavyLine::TPZWavyLine(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_80 = (int64_t *)&in_RDI[2].fMatId;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff50);
    local_80 = local_80 + 3;
  } while ((TPZCompEl **)local_80 != &in_RDI[3].fReference);
  for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[2].fMatId + (long)local_48 * 6),&local_60);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x17ed795);
  }
  pzgeom::TPZNodeRep<2,_pztopology::TPZLine>::Initialize
            ((TPZNodeRep<2,_pztopology::TPZLine> *)(in_RDI + 1),in_RDI);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(id,matind,mesh) , fGeo(nodeindexes) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}